

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined1 *puVar1;
  long lVar2;
  unpacked_endpoint *pSrc;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      puVar1 = (undefined1 *)((long)pSrc_void + lVar2);
      *(undefined1 *)((long)pDst_void + lVar2) = *puVar1;
      *(undefined1 *)((long)pDst_void + lVar2 + 1) = puVar1[1];
      *(undefined1 *)((long)pDst_void + lVar2 + 2) = puVar1[2];
      *(undefined1 *)((long)pDst_void + lVar2 + 3) = puVar1[3];
      *(undefined1 *)((long)pDst_void + lVar2 + 4) = puVar1[4];
      *(undefined1 *)((long)pDst_void + lVar2 + 5) = puVar1[5];
      *(undefined1 *)((long)pDst_void + lVar2 + 6) = puVar1[6];
      *(undefined1 *)((long)pDst_void + lVar2 + 7) = puVar1[7];
      lVar2 = lVar2 + 8;
    } while (puVar1 + 8 != (undefined1 *)((long)pSrc_void + (ulong)num * 8));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }